

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFontGlyphRangesBuilder::AddRanges(ImFontGlyphRangesBuilder *this,ImWchar *ranges)

{
  uint *puVar1;
  ushort uVar2;
  long lVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  uVar4 = *ranges;
  do {
    if (uVar4 == 0) {
      return;
    }
    uVar2 = ranges[1];
    if (uVar4 <= uVar2) {
      lVar3 = *(long *)(this + 8);
      uVar5 = (uint)uVar4;
      do {
        uVar6 = uVar5 >> 5 & 0x7ff;
        if (*(int *)this <= (int)uVar6) {
          __assert_fail("i >= 0 && i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                        ,0x74f,"T &ImVector<unsigned int>::operator[](int) [T = unsigned int]");
        }
        puVar1 = (uint *)(lVar3 + (ulong)uVar6 * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
        bVar7 = uVar5 < uVar2;
        uVar5 = uVar5 + 1;
      } while (bVar7);
    }
    uVar4 = ranges[2];
    ranges = ranges + 2;
  } while( true );
}

Assistant:

void ImFontGlyphRangesBuilder::AddRanges(const ImWchar* ranges)
{
    for (; ranges[0]; ranges += 2)
        for (unsigned int c = ranges[0]; c <= ranges[1] && c <= IM_UNICODE_CODEPOINT_MAX; c++) //-V560
            AddChar((ImWchar)c);
}